

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexes.cpp
# Opt level: O0

Keylet * __thiscall
jbcoin::keylet::offer_t::operator()
          (Keylet *__return_storage_ptr__,offer_t *this,AccountID *id,uint32_t seq)

{
  uint256 local_3c;
  uint32_t local_1c;
  AccountID *pAStack_18;
  uint32_t seq_local;
  AccountID *id_local;
  offer_t *this_local;
  
  local_1c = seq;
  pAStack_18 = id;
  id_local = (AccountID *)this;
  getOfferIndex(&local_3c,id,seq);
  Keylet::Keylet(__return_storage_ptr__,ltOFFER,&local_3c);
  return __return_storage_ptr__;
}

Assistant:

Keylet offer_t::operator()(AccountID const& id,
    std::uint32_t seq) const
{
    return { ltOFFER,
        getOfferIndex(id, seq) };
}